

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O0

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitUnaryLogNot(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  EmitExpressionInfo EVar1;
  bool bVar2;
  RegSlot R0;
  AsmJsCompilationException *pAVar3;
  RegSlot dst;
  AsmJsType local_4c;
  AsmJsType *local_48;
  AsmJsType *rType;
  EmitExpressionInfo *local_38;
  EmitExpressionInfo *rhsEmit;
  ParseNode *pPStack_28;
  int count;
  ParseNode *rhs;
  ParseNode *pnode_local;
  AsmJSByteCodeGenerator *this_local;
  EmitExpressionInfo emitInfo;
  
  rhs = pnode;
  pnode_local = (ParseNode *)this;
  pPStack_28 = ParserWrapper::GetUnaryNode(pnode);
  rhsEmit._4_4_ = 1;
  for (; pPStack_28->nop == knopLogNot; pPStack_28 = ParserWrapper::GetUnaryNode(pPStack_28)) {
    rhsEmit._4_4_ = rhsEmit._4_4_ + 1;
  }
  rType = (AsmJsType *)Emit(this,pPStack_28);
  local_38 = (EmitExpressionInfo *)&rType;
  local_48 = (AsmJsType *)((long)&rType + 4);
  StartStatement(this,rhs);
  AsmJsType::AsmJsType(&local_4c,Int);
  EmitExpressionInfo::EmitExpressionInfo((EmitExpressionInfo *)&this_local,&local_4c);
  bVar2 = AsmJsType::isInt(local_48);
  if (!bVar2) {
    pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException(pAVar3,L"Type not supported for unary !");
    __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
  }
  bVar2 = AsmJsFunc::IsValidLocation<int>(this->mFunction,local_38);
  if (!bVar2) {
    pAVar3 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (pAVar3,L"Invalid Node location[%d] ",(ulong)(local_38->super_EmitInfoBase).location);
    __cxa_throw(pAVar3,&AsmJsCompilationException::typeinfo,0);
  }
  R0 = GetAndReleaseUnaryLocations<int>(this,local_38);
  if ((rhsEmit._4_4_ & 1) == 0) {
    AsmJsByteCodeWriter::AsmReg2(&this->mWriter,Conv_ITB,R0,(local_38->super_EmitInfoBase).location)
    ;
  }
  else {
    AsmJsByteCodeWriter::AsmReg2
              (&this->mWriter,LogNot_Int,R0,(local_38->super_EmitInfoBase).location);
  }
  this_local._0_4_ = R0;
  EndStatement(this,rhs);
  EVar1.type.which_ = this_local._4_4_;
  EVar1.super_EmitInfoBase.location = this_local._0_4_;
  return EVar1;
}

Assistant:

Js::EmitExpressionInfo AsmJSByteCodeGenerator::EmitUnaryLogNot( ParseNode * pnode )
    {
        ParseNode* rhs = ParserWrapper::GetUnaryNode( pnode );
        int count = 1;
        while( rhs->nop == knopLogNot )
        {
            ++count;
            rhs = ParserWrapper::GetUnaryNode( rhs );
        }

        const EmitExpressionInfo& rhsEmit = Emit( rhs );
        const AsmJsType& rType = rhsEmit.type;
        StartStatement(pnode);
        EmitExpressionInfo emitInfo( AsmJsType::Int );
        if( rType.isInt() )
        {
            CheckNodeLocation( rhsEmit, int );
            RegSlot dst = GetAndReleaseUnaryLocations<int>( &rhsEmit );
            if( count & 1 )
            {
                // do the conversion only if we have an odd number of the operator
                mWriter.AsmReg2( OpCodeAsmJs::LogNot_Int, dst, rhsEmit.location );
            }
            else
            {
                // otherwise, make sure the result is 0|1
                mWriter.AsmReg2( OpCodeAsmJs::Conv_ITB, dst, rhsEmit.location );
            }
            emitInfo.location = dst;
        }
        else
        {
            throw AsmJsCompilationException( _u("Type not supported for unary !") );
        }
        EndStatement(pnode);
        return emitInfo;
    }